

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

void write1_cb(uv_write_t *req,int status)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined1 local_20 [16];
  
  auVar1._8_8_ = local_20._8_8_;
  auVar1._0_8_ = local_20._0_8_;
  if (req == (uv_write_t *)0x0) {
    pcVar4 = "req != NULL";
    uVar3 = 0x9e;
LAB_00158e2f:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
            ,uVar3,pcVar4);
    abort();
  }
  if (status == 0) {
    if (shutdown_requested == 0) {
      local_20 = uv_buf_init("P",1);
      iVar2 = uv_write(&write_req,req->handle,local_20,1,write1_cb);
      if (iVar2 != 0) {
        pcVar4 = "r == 0";
        uVar3 = 0xa9;
        goto LAB_00158e2f;
      }
      write_cb_called = write_cb_called + 1;
    }
  }
  else if (shutdown_cb_called == 0) {
    pcVar4 = "shutdown_cb_called";
    uVar3 = 0xa0;
    local_20 = auVar1;
    goto LAB_00158e2f;
  }
  return;
}

Assistant:

static void write1_cb(uv_write_t* req, int status) {
  uv_buf_t buf;
  int r;

  ASSERT(req != NULL);
  if (status) {
    ASSERT(shutdown_cb_called);
    return;
  }

  if (shutdown_requested)
    return;

  buf = uv_buf_init("P", 1);
  r = uv_write(&write_req, req->handle, &buf, 1, write1_cb);
  ASSERT(r == 0);

  write_cb_called++;
}